

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O3

void __thiscall
cfdcapi_coin_CfCoinSelection_BTC1_Test::TestBody(cfdcapi_coin_CfCoinSelection_BTC1_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  void *handle_00;
  void *coin_select_handle_00;
  pointer pUVar4;
  bool bVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  char *in_R9;
  long lVar9;
  long lVar10;
  AssertionResult gtest_ar_;
  int ret;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  int64_t amount;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  int64_t utxo_fee_amount;
  void *handle;
  AssertHelper local_68;
  void *coin_select_handle;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  int32_t utxo_index;
  long local_38;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxos,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x2b1,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&utxos,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxos);
    if (((gtest_ar_._0_8_ != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&utxos);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x2b2,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee_amount,(Message *)&utxos);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar._0_8_ != &local_c8) {
      operator_delete((void *)gtest_ar._0_8_);
    }
    if (((utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) &&
        (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       (utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0)) {
      (**(code **)((utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                    super__Vector_impl_data._M_start)->block_height + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  coin_select_handle = (void *)0x0;
  CfdGetElementsUtxoListByC(&utxos,false);
  pcVar7 = "";
  ret = CfdInitializeCoinSelection
                  (handle,(int)((ulong)((long)utxos.
                                              super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)utxos.
                                             super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          0x684bda13,3,"",2000,20.0,20.0,-1.0,-1,&coin_select_handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x2c7,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
    if (((gtest_ar_._0_8_ != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),void*>
            ((internal *)&gtest_ar,"nullptr","coin_select_handle",(void **)&gtest_ar_,
             &coin_select_handle);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x2c8,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
    if (((gtest_ar_._0_8_ != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (ret == 0) {
    if (0 < (int)((ulong)((long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x684bda13) {
      lVar9 = 0x80;
      lVar10 = 0;
      do {
        pUVar4 = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                 super__Vector_impl_data._M_start;
        gtest_ar._0_8_ = operator_new(0x20);
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (gtest_ar._0_8_ + 0x20);
        uVar1 = *(undefined8 *)(pUVar4->block_hash + lVar9 + -0x60);
        uVar2 = *(undefined8 *)(pUVar4->block_hash + lVar9 + -0x60 + 8);
        uVar3 = *(undefined8 *)(pUVar4->block_hash + lVar9 + -0x50 + 8);
        *(undefined8 *)(gtest_ar._0_8_ + 0x10) = *(undefined8 *)(pUVar4->block_hash + lVar9 + -0x50)
        ;
        *(undefined8 *)(gtest_ar._0_8_ + 0x18) = uVar3;
        *(undefined8 *)gtest_ar._0_8_ = uVar1;
        *(undefined8 *)(gtest_ar._0_8_ + 8) = uVar2;
        local_c8._M_allocated_capacity = (size_type)gtest_ar.message_.ptr_;
        cfd::core::ByteData::ByteData
                  ((ByteData *)&utxo_fee_amount,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
        local_38 = lVar10;
        if (gtest_ar._0_8_ != 0) {
          operator_delete((void *)gtest_ar._0_8_);
        }
        coin_select_handle_00 = coin_select_handle;
        handle_00 = handle;
        cfd::core::ByteData::GetBytes(&local_a0,(ByteData *)&utxo_fee_amount);
        cfd::core::ByteData256::ByteData256((ByteData256 *)&amount,&local_a0);
        cfd::core::Txid::Txid((Txid *)&gtest_ar_,(ByteData256 *)&amount);
        cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar,(Txid *)&gtest_ar_);
        lVar10 = local_38;
        ret = CfdAddCoinSelectionUtxo
                        (handle_00,coin_select_handle_00,(int32_t)local_38,(char *)gtest_ar._0_8_,
                         *(uint32_t *)(pUVar4->block_hash + lVar9 + -0x40),
                         *(int64_t *)(pUVar4->block_hash + lVar9 + -8),"",
                         "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x"
                        );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)gtest_ar._0_8_ != &local_c8) {
          operator_delete((void *)gtest_ar._0_8_);
        }
        gtest_ar_._0_8_ = &PTR__Txid_00723450;
        if (gtest_ar_.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete(gtest_ar_.message_.ptr_);
        }
        if (amount != 0) {
          operator_delete((void *)amount);
        }
        if ((void *)CONCAT44(local_a0.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             local_a0.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_a0.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           local_a0.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_4_));
        }
        gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar7 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&amount,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                     ,0x2d4,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&amount,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&amount);
          if (((gtest_ar_._0_8_ != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
             (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (utxo_fee_amount != 0) {
          operator_delete((void *)utxo_fee_amount);
        }
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0xd8;
      } while (lVar10 < (int)((ulong)((long)utxos.
                                            super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)utxos.
                                           super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        0x684bda13);
    }
    pcVar7 = "";
    ret = CfdAddCoinSelectionAmount(handle,coin_select_handle,0,180000000,"");
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x2d8,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
      if (((gtest_ar_._0_8_ != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    utxo_fee_amount = 0;
    ret = CfdFinalizeCoinSelection(handle,coin_select_handle,&utxo_fee_amount);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&amount,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x2dc,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&amount,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&amount);
      if (((gtest_ar_._0_8_ != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_._0_4_ = 0x1cc0;
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar,"7360","utxo_fee_amount",(int *)&gtest_ar_,&utxo_fee_amount);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&amount,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x2dd,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&amount,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&amount);
      if (((gtest_ar_._0_8_ != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    utxo_index = 0;
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_c8._M_allocated_capacity = 0;
    uVar8 = 0;
    if (utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_start) {
      amount = 0;
    }
    else {
      do {
        ret = CfdGetSelectedCoinIndex(handle,coin_select_handle,(uint32_t)uVar8,&utxo_index);
        amount = amount & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&amount,&ret);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&amount);
          pcVar7 = "";
          if (gtest_ar_.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                     ,0x2e4,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&amount);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
          if (((amount != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) && (amount != 0))
          {
            (**(code **)(*(long *)amount + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (utxo_index == -1) break;
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_c8._M_allocated_capacity) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&gtest_ar,(iterator)gtest_ar.message_.ptr_,
                     &utxo_index);
        }
        else {
          *(int32_t *)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p = utxo_index;
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 4);
        }
        uVar8 = (ulong)((uint32_t)uVar8 + 1);
        uVar6 = ((long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
      amount = (long)gtest_ar.message_.ptr_ - gtest_ar._0_8_ >> 2;
    }
    local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 4;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar_,"4","indexes.size()",(int *)&local_a0,(unsigned_long *)&amount
              );
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&amount);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x2ea,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&amount);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
      if (((amount != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) && (amount != 0)) {
        (**(code **)(*(long *)amount + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((long)gtest_ar.message_.ptr_ - gtest_ar._0_8_ == 0x10) {
      amount = CONCAT44(amount._4_4_,1);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"1","indexes[0]",(int *)&amount,(int *)gtest_ar._0_8_);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&amount);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x2ed,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&amount);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
        if (((amount != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) && (amount != 0)) {
          (**(code **)(*(long *)amount + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      amount = CONCAT44(amount._4_4_,3);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"3","indexes[1]",(int *)&amount,(int *)(gtest_ar._0_8_ + 4))
      ;
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&amount);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x2ee,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&amount);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
        if (((amount != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) && (amount != 0)) {
          (**(code **)(*(long *)amount + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      amount = CONCAT44(amount._4_4_,10);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"10","indexes[2]",(int *)&amount,(int *)(gtest_ar._0_8_ + 8)
                );
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&amount);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x2ef,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&amount);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
        if (((amount != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) && (amount != 0)) {
          (**(code **)(*(long *)amount + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      amount = CONCAT44(amount._4_4_,6);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"6","indexes[3]",(int *)&amount,
                 (int *)(gtest_ar._0_8_ + 0xc));
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&amount);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x2f0,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&amount);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
        if (((amount != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) && (amount != 0)) {
          (**(code **)(*(long *)amount + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    amount = 0;
    ret = CfdGetSelectedCoinAssetAmount(handle,coin_select_handle,0,&amount);
    local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&local_a0,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x301,pcVar7);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (((CONCAT44(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         ((long *)CONCAT44(local_a0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_a0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_a0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_a0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0xad57064;
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)&gtest_ar_,"181760100","amount",(int *)&local_a0,&amount);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x302,pcVar7);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (((CONCAT44(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) &&
          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         ((long *)CONCAT44(local_a0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_a0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_a0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_a0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (gtest_ar._0_8_ != 0) {
      operator_delete((void *)gtest_ar._0_8_);
    }
  }
  ret = CfdFreeCoinSelectionHandle(handle,coin_select_handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x305,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
    if (((gtest_ar_._0_8_ != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  ret = CfdFreeHandle(handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee_amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x308,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&utxo_fee_amount,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee_amount);
    if (((gtest_ar_._0_8_ != 0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       (gtest_ar_._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(cfdcapi_coin, CfCoinSelection_BTC1) {
  constexpr const char* kDescriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  auto convert_to_byte = [](const uint8_t* byte_array, size_t size) -> ByteData {
    std::vector<uint8_t> bytes(size);
    memcpy(bytes.data(), byte_array, bytes.size());
    return ByteData(bytes);
  };

  void* coin_select_handle = nullptr;
  std::vector<Utxo> utxos = CfdGetElementsUtxoListByC(false);
  int64_t tx_fee_amount = 2000;
  double effective_fee_rate = 20;
  double long_term_fee_rate = 20;
  double dust_fee_rate = -1;
  int64_t knapsack_min_change = -1;

  ret = CfdInitializeCoinSelection(
    handle, static_cast<uint32_t>(utxos.size()), 3,
    "", tx_fee_amount,
    effective_fee_rate, long_term_fee_rate, dust_fee_rate,
    knapsack_min_change, &coin_select_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_NE(nullptr, coin_select_handle);

  if (ret == kCfdSuccess) {
    for (int32_t index = 0; index < static_cast<int32_t>(utxos.size()); ++index) {
      const Utxo& utxo = utxos[index];
      ByteData txid = convert_to_byte(utxo.txid, sizeof(utxo.txid));
      ret = CfdAddCoinSelectionUtxo(
          handle, coin_select_handle, index,
          Txid(ByteData256(txid.GetBytes())).GetHex().c_str(), utxo.vout,
          utxo.amount,
          "",
          kDescriptor);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdAddCoinSelectionAmount(handle, coin_select_handle, 0, 180000000, "");
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t utxo_fee_amount = 0;
    ret = CfdFinalizeCoinSelection(handle, coin_select_handle, &utxo_fee_amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(7360, utxo_fee_amount);

    int32_t utxo_index = 0;
    std::vector<int32_t> indexes;
    for (uint32_t index = 0; index < utxos.size(); ++index) {
      ret = CfdGetSelectedCoinIndex(
          handle, coin_select_handle, index, &utxo_index);
      EXPECT_EQ(kCfdSuccess, ret);
      if (utxo_index == -1) {
        break;
      }
      indexes.push_back(utxo_index);
    }
    EXPECT_EQ(4, indexes.size());

    if (indexes.size() == 4) {
      EXPECT_EQ(1, indexes[0]);
      EXPECT_EQ(3, indexes[1]);
      EXPECT_EQ(10, indexes[2]);
      EXPECT_EQ(6, indexes[3]);
      /*
      req:
            A,  115800000
            B,  347180050
            C,   37654200
      res:
        8:  B,  346430050
        7:  B,     750000
        10: C,   37654200
        1:  A,   78125000
        3:  A,   39062500
      */
    }

    int64_t amount = 0;
    ret = CfdGetSelectedCoinAssetAmount(handle, coin_select_handle, 0, &amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(181760100, amount);
  }
  ret = CfdFreeCoinSelectionHandle(handle, coin_select_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}